

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_enc.c
# Opt level: O3

void VP8DefaultProbas(VP8Encoder *enc)

{
  (enc->proba_).use_skip_proba_ = 0;
  (enc->proba_).segments_[0] = 0xff;
  (enc->proba_).segments_[1] = 0xff;
  (enc->proba_).segments_[2] = 0xff;
  memcpy((enc->proba_).coeffs_,VP8CoeffsProba0,0x420);
  (enc->proba_).dirty_ = 1;
  return;
}

Assistant:

void VP8DefaultProbas(VP8Encoder* const enc) {
  VP8EncProba* const probas = &enc->proba_;
  probas->use_skip_proba_ = 0;
  memset(probas->segments_, 255u, sizeof(probas->segments_));
  memcpy(probas->coeffs_, VP8CoeffsProba0, sizeof(VP8CoeffsProba0));
  // Note: we could hard-code the level_costs_ corresponding to VP8CoeffsProba0,
  // but that's ~11k of static data. Better call VP8CalculateLevelCosts() later.
  probas->dirty_ = 1;
}